

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw_gl3.cpp
# Opt level: O1

void ImGui_ImplGlfw_KeyCallback(GLFWwindow *param_1,int key,int param_3,int action,int mods)

{
  ImGuiIO *pIVar1;
  bool bVar2;
  undefined1 uVar3;
  
  pIVar1 = ImGui::GetIO();
  if (action == 1) {
    bVar2 = true;
  }
  else {
    if (action != 0) goto LAB_00135d7a;
    bVar2 = false;
  }
  pIVar1->KeysDown[key] = bVar2;
LAB_00135d7a:
  bVar2 = pIVar1->KeysDown[0x159];
  uVar3 = true;
  if (pIVar1->KeysDown[0x155] != false) {
    bVar2 = true;
  }
  pIVar1->KeyCtrl = bVar2;
  bVar2 = pIVar1->KeysDown[0x158];
  if (pIVar1->KeysDown[0x154] != false) {
    bVar2 = true;
  }
  pIVar1->KeyShift = bVar2;
  bVar2 = pIVar1->KeysDown[0x15a];
  if (pIVar1->KeysDown[0x156] != false) {
    bVar2 = true;
  }
  pIVar1->KeyAlt = bVar2;
  if (pIVar1->KeysDown[0x157] == false) {
    uVar3 = (undefined1)*(undefined4 *)(pIVar1->KeysDown + 0x15b);
  }
  pIVar1->KeySuper = (bool)uVar3;
  return;
}

Assistant:

void ImGui_ImplGlfw_KeyCallback(GLFWwindow*, int key, int, int action, int mods)
{
    ImGuiIO& io = ImGui::GetIO();
    if (action == GLFW_PRESS)
        io.KeysDown[key] = true;
    if (action == GLFW_RELEASE)
        io.KeysDown[key] = false;

    (void)mods; // Modifiers are not reliable across systems
    io.KeyCtrl = io.KeysDown[GLFW_KEY_LEFT_CONTROL] || io.KeysDown[GLFW_KEY_RIGHT_CONTROL];
    io.KeyShift = io.KeysDown[GLFW_KEY_LEFT_SHIFT] || io.KeysDown[GLFW_KEY_RIGHT_SHIFT];
    io.KeyAlt = io.KeysDown[GLFW_KEY_LEFT_ALT] || io.KeysDown[GLFW_KEY_RIGHT_ALT];
    io.KeySuper = io.KeysDown[GLFW_KEY_LEFT_SUPER] || io.KeysDown[GLFW_KEY_RIGHT_SUPER];
}